

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O2

void __thiscall SharedIdGetter::SharedIdGetter(SharedIdGetter *this,uid_t start,uid_t count)

{
  _Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false> _Var1;
  ulong uVar2;
  int iVar3;
  _Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false> local_30;
  
  (this->ids_stack_)._M_t.
  super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl =
       (SharedMemoryArray<unsigned_int> *)0x0;
  (this->stack_head_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl =
       (SharedMemoryObject<unsigned_long> *)0x0;
  SharedMutex::SharedMutex(&this->mutex_);
  std::make_unique<SharedMemoryArray<unsigned_int>,unsigned_int&>((uint *)&local_30);
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (SharedMemoryArray<unsigned_int> *)0x0;
  std::
  __uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
           *)this,_Var1._M_head_impl);
  std::
  unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                 *)&local_30);
  std::make_unique<SharedMemoryObject<unsigned_long>>();
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (SharedMemoryArray<unsigned_int> *)0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
           *)&this->stack_head_,(pointer)_Var1._M_head_impl);
  std::
  unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
                 *)&local_30);
  _Var1._M_head_impl =
       (this->ids_stack_)._M_t.
       super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
       .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl;
  iVar3 = start - 1;
  uVar2 = 0;
  while( true ) {
    if (count <= uVar2) break;
    *(uid_t *)((long)(_Var1._M_head_impl)->ptr_ + uVar2 * 4) = count + iVar3;
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
  }
  *((this->stack_head_)._M_t.
    super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
    .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_ =
       (ulong)count;
  return;
}

Assistant:

SharedIdGetter::SharedIdGetter(uid_t start, uid_t count) {
    ids_stack_ = std::make_unique<SharedMemoryArray<uid_t>>(count);
    stack_head_ = std::make_unique<SharedMemoryObject<size_t>>();
    for (size_t i = 0; i < count; ++i) {
        (*ids_stack_)[i] = start + count - 1 - i; // Lower the ID is, closer to stack head it is
    }
    (*stack_head_->get()) = count;
}